

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O3

void make_edges(chunk_conflict *c,_Bool ragged,_Bool valley)

{
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t *pwVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  loc lVar9;
  loc lVar10;
  uint uVar11;
  ulong uVar12;
  loc lVar13;
  wchar_t path_x [3];
  uint local_50;
  uint auStack_3c [3];
  
  uVar2 = Rand_div(2);
  uVar11 = uVar2 + 2;
  if ((int)uVar2 < -1) {
    iVar8 = c->width;
  }
  else {
    uVar5 = 1;
    if (1 < (int)uVar11) {
      uVar5 = (ulong)uVar11;
    }
    iVar8 = c->width;
    uVar12 = 0;
    do {
      uVar2 = Rand_div((iVar8 + -0x14) / (int)uVar11 - 2);
      iVar8 = c->width;
      auStack_3c[uVar12] = ((int)uVar12 * (iVar8 + -0x14)) / (int)uVar11 + uVar2 + 10;
      uVar12 = uVar12 + 1;
    } while (uVar5 != uVar12);
  }
  if (0 < iVar8) {
    local_50 = valley + 4;
    uVar4 = (uint)valley * 3 + 7;
    lVar13.x = L'\0';
    lVar13.y = L'\0';
    uVar7 = local_50;
    do {
      if (ragged) {
        uVar2 = Rand_div(3);
        uVar7 = (uVar7 - uVar2) + 1;
        if ((int)uVar4 <= (int)uVar7) {
          uVar7 = uVar4;
        }
        if ((int)uVar7 < 2) {
          uVar7 = 1;
        }
        uVar5 = 0;
        do {
          _Var1 = square_ismark(c,(loc)((long)lVar13 + uVar5));
          if (!_Var1) {
            square_set_feat(c,(loc)((long)lVar13 + uVar5),FEAT_PERM);
          }
          uVar5 = uVar5 + 0x100000000;
        } while ((ulong)uVar7 << 0x20 != uVar5);
        if ((lVar13 != (loc)0x0 && valley) &&
           (lVar10.y = L'\0', lVar10.x = player->upkeep->path_coord, lVar13 == lVar10)) {
          lVar10 = (loc)((ulong)uVar7 << 0x20 | (ulong)lVar13);
          square_set_feat(c,lVar10,FEAT_PASS_RUBBLE);
          player_place((chunk_conflict2 *)c,player,(loc_conflict)lVar10);
        }
      }
      else {
        square_set_feat(c,lVar13,FEAT_PERM);
      }
      lVar13 = (loc)((long)lVar13 + 1);
    } while ((long)lVar13 < (long)c->width);
    if (0 < c->width) {
      uVar5 = 0;
      iVar8 = 0;
      do {
        if ((!ragged) || ((uVar7 = 7, valley && (uVar7 = 10, player->depth == 0x46)))) {
          square_set_feat(c,(loc)((ulong)(c->height - 1) << 0x20 | uVar5),FEAT_PERM);
        }
        else {
          uVar2 = Rand_div(3);
          local_50 = (local_50 - uVar2) + 1;
          if ((int)uVar7 <= (int)local_50) {
            local_50 = uVar7;
          }
          if ((int)local_50 < 2) {
            local_50 = 1;
          }
          uVar7 = c->height;
          uVar4 = uVar7 - 1;
          if ((int)(~local_50 + uVar7) < (int)uVar4) {
            do {
              uVar4 = uVar7;
              lVar13 = (loc)((ulong)(uVar4 - 1) << 0x20 | uVar5);
              _Var1 = square_ismark(c,lVar13);
              if (!_Var1) {
                if ((!valley) || (pwVar3 = &FEAT_VOID, uVar4 == c->height)) {
                  pwVar3 = &FEAT_PERM;
                }
                square_set_feat(c,lVar13,*pwVar3);
              }
              uVar7 = uVar4 - 1;
            } while ((int)(c->height + ~local_50) < (int)(uVar4 - 2));
            uVar4 = uVar4 - 2;
          }
          if ((iVar8 < (int)uVar11 && valley) && (uVar5 == auStack_3c[iVar8])) {
            lVar13 = (loc)((ulong)uVar4 << 0x20 | uVar5);
            square_set_feat(c,lVar13,FEAT_MORE_SOUTH);
            square_mark(c,lVar13);
            iVar8 = iVar8 + 1;
          }
        }
        uVar5 = uVar5 + 1;
      } while ((long)uVar5 < (long)c->width);
    }
  }
  if (0 < c->height) {
    uVar5 = 5;
    lVar9.x = L'\0';
    lVar9.y = L'\0';
    lVar6 = 0;
    do {
      if (ragged) {
        uVar2 = Rand_div(3);
        uVar11 = ((int)uVar5 - uVar2) + 1;
        if (9 < (int)uVar11) {
          uVar11 = 10;
        }
        if ((int)uVar11 < 2) {
          uVar11 = 1;
        }
        uVar5 = (ulong)uVar11;
        uVar12 = uVar5;
        lVar13 = lVar9;
        do {
          _Var1 = square_ismark(c,lVar13);
          if (!_Var1) {
            square_set_feat(c,lVar13,FEAT_PERM);
          }
          lVar13 = (loc)((long)lVar13 + 1);
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      else {
        square_set_feat(c,(loc)(lVar6 << 0x20),FEAT_PERM);
      }
      lVar6 = lVar6 + 1;
      lVar9 = (loc)((long)lVar9 + 0x100000000);
    } while (lVar6 < c->height);
    if (0 < c->height) {
      uVar11 = 5;
      lVar6 = 0;
      do {
        if (ragged) {
          uVar2 = Rand_div(3);
          uVar11 = (uVar11 - uVar2) + 1;
          if (9 < (int)uVar11) {
            uVar11 = 10;
          }
          if ((int)uVar11 < 2) {
            uVar11 = 1;
          }
          uVar7 = c->width - 1;
          if ((int)(c->width + ~uVar11) < (int)uVar7) {
            do {
              lVar13 = (loc)((ulong)uVar7 | lVar6 << 0x20);
              _Var1 = square_ismark(c,lVar13);
              if (!_Var1) {
                square_set_feat(c,lVar13,FEAT_PERM);
              }
              uVar7 = uVar7 - 1;
            } while ((int)(c->width + ~uVar11) < (int)uVar7);
          }
        }
        else {
          square_set_feat(c,(loc)((ulong)(c->width - 1) | lVar6 << 0x20),FEAT_PERM);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < c->height);
    }
  }
  return;
}

Assistant:

static void make_edges(struct chunk *c, bool ragged, bool valley)
{
	int i, j, num = 2;
	int path_x[3];
	struct loc grid;

	/* Prepare places for down slides */
	num += randint0(2);
	for (i = 0; i < num; i++)
		/*
		 * Skip first and last ten columns to avoid surrounding the
		 * slide in permanent walls.  Avoid last two columns in each
		 * interval to limit the possibility of nearby slides.
		 */
		path_x[i] = 10 + randint0((c->width - 20) / num - 2)
			+ (i * (c->width - 20)) / num;

	/* Special boundary walls -- Top */
	i = (valley ? 5 : 4);
	for (grid.x = 0; grid.x < c->width; grid.x++) {
		if (ragged) {
			i += 1 - randint0(3);
			if (i > (valley ? 10 : 7))
				i = (valley ? 10 : 7);
			if (i < 1)
				i = 1;
			for (grid.y = 0; grid.y < i; grid.y++) {
				/* Clear previous contents, add perma-wall */
				if (!square_ismark(c, grid)) {
					square_set_feat(c, grid, FEAT_PERM);
				}
			}
			if (valley && (grid.x > 0) &&
				(grid.x == player->upkeep->path_coord)) {
				if (grid.y == 0) {
					grid.y++;
				}
				square_set_feat(c, grid, FEAT_PASS_RUBBLE);
				player_place(c, player, grid);
			}
		} else {
			grid.y = 0;

			/* Clear previous contents, add perma-wall */
			square_set_feat(c, grid, FEAT_PERM);
		}
	}


	/* Special boundary walls -- Bottom */
	i = (valley ? 5 : 4);
	j = 0;
	for (grid.x = 0; grid.x < c->width; grid.x++) {
		if (ragged && !(valley && (player->depth == 70))) {
			i += 1 - randint0(3);
			if (i > (valley ? 10 : 7))
				i = (valley ? 10 : 7);
			if (i < 1)
				i = 1;
			for (grid.y = c->height - 1; grid.y > c->height - 1 - i; grid.y--) {
				/* Clear previous contents, add perma-wall or void */
				if (!square_ismark(c, grid)) {
					square_set_feat(c, grid, (valley && grid.y != c->height - 1) ? FEAT_VOID : FEAT_PERM);
				}
			}
			/* Down slides */
			if ((j < num) && valley)
				if (grid.x == path_x[j]) {
					square_set_feat(c, grid, FEAT_MORE_SOUTH);
					/* Mark so it won't be overwritten. */
					square_mark(c, grid);
					j++;
				}
		} else {
			grid.y = c->height - 1;

			/* Clear previous contents, add perma-wall */
			square_set_feat(c, grid, FEAT_PERM);
		}
	}

	/* Special boundary walls -- Left */
	i = 5;
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		if (ragged) {
			i += 1 - randint0(3);
			if (i > 10)
				i = 10;
			if (i < 1)
				i = 1;
			for (grid.x = 0; grid.x < i; grid.x++) {
				/* Clear previous contents, add perma-wall */
				if (!square_ismark(c, grid)) {
					square_set_feat(c, grid, FEAT_PERM);
				}
			}
		} else {
			grid.x = 0;

			/* Clear previous contents, add perma-wall */
			square_set_feat(c, grid, FEAT_PERM);
		}
	}

	/* Special boundary walls -- Right */
	i = 5;
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		if (ragged) {
			i += 1 - randint0(3);
			if (i > 10)
				i = 10;
			if (i < 1)
				i = 1;
			for (grid.x = c->width - 1; grid.x > c->width - 1 - i; grid.x--) {
				/* Clear previous contents, add perma-wall */
				if (!square_ismark(c, grid)) {
					square_set_feat(c, grid, FEAT_PERM);
				}
			}
		} else {
			grid.x = c->width - 1;

			/* Clear previous contents, add perma-wall */
			square_set_feat(c, grid, FEAT_PERM);
		}
	}
}